

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O0

void Abc_NtkFinLocalSetup(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Int_t *vResArray)

{
  int iVar1;
  int i_00;
  Vec_Int_t *p;
  Vec_Int_t *vArray;
  int iObj;
  int iFin;
  int i;
  Vec_Int_t *vResArray_local;
  Vec_Wec_t *vMap2_local;
  Vec_Int_t *vList_local;
  Vec_Int_t *vPairs_local;
  
  Vec_IntClear(vResArray);
  for (iObj = 0; iVar1 = Vec_IntSize(vList), iObj < iVar1; iObj = iObj + 1) {
    iVar1 = Vec_IntEntry(vList,iObj);
    i_00 = Vec_IntEntry(vPairs,iVar1 << 1);
    p = Vec_WecEntry(vMap2,i_00);
    Vec_IntPushTwo(p,iVar1,iObj);
    Vec_IntPushTwo(vResArray,iVar1,iObj);
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetup( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Int_t * vResArray )
{
    int i, iFin;
    Vec_IntClear( vResArray );
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntPushTwo( vArray, iFin, i );
        Vec_IntPushTwo( vResArray, iFin, i );
    }
}